

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O2

void __thiscall
ans_smsb_encode<1U>::encode_symbol
          (ans_smsb_encode<1U> *this,uint64_t *state,uint32_t sym,uint8_t **out_u8)

{
  pointer peVar1;
  uint uVar2;
  pointer peVar3;
  uint8_t *puVar4;
  uint16_t uVar5;
  ulong uVar6;
  
  uVar5 = ans_smsb_mapping_and_exceptions(sym,out_u8);
  peVar3 = (this->table).super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar6 = *state;
  peVar1 = peVar3 + uVar5;
  if (peVar3[uVar5].sym_upper_bound <= uVar6) {
    puVar4 = *out_u8;
    *(int *)puVar4 = (int)uVar6;
    uVar6 = uVar6 >> 0x20;
    *out_u8 = puVar4 + 4;
    *state = uVar6;
  }
  uVar2 = peVar1->freq;
  *state = (ulong)peVar1->base + uVar6 % (ulong)uVar2 + (uVar6 / uVar2) * this->frame_size;
  return;
}

Assistant:

void encode_symbol(uint64_t& state, uint32_t sym, uint8_t*& out_u8)
    {
        auto mapped_sym = ans_smsb_mapping_and_exceptions(sym, out_u8);
        const auto& e = table[mapped_sym];
        if (state >= e.sym_upper_bound) {
            auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
            *out_ptr_u32 = state & 0xFFFFFFFF;
            out_u8 += sizeof(uint32_t);
            state = state >> constants::RADIX_LOG2;
        }
        state = ((state / e.freq) * frame_size) + (state % e.freq) + e.base;
    }